

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void I210ToAR30Row_C(uint16_t *src_y,uint16_t *src_u,uint16_t *src_v,uint8_t *rgb_buf,
                    YuvConstants *yuvconstants,int width)

{
  short sVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  
  if (1 < width) {
    sVar1 = yuvconstants->kUVBiasB[0];
    sVar2 = yuvconstants->kUVBiasG[0];
    sVar3 = yuvconstants->kUVBiasR[0];
    iVar4 = yuvconstants->kYToRgb[0] * 0x40;
    iVar11 = 0;
    do {
      uVar9 = (uint)((short)*src_y * iVar4) >> 0x10;
      uVar6 = (uint)(int)(short)*src_u >> 2;
      if (0xfe < (int)(short)*src_u >> 2) {
        uVar6 = 0xff;
      }
      uVar6 = uVar6 & 0xff;
      uVar10 = (uint)(int)(short)*src_v >> 2;
      if (0xfe < (int)(short)*src_v >> 2) {
        uVar10 = 0xff;
      }
      iVar7 = ((int)sVar1 - (int)yuvconstants->kUVToB[0] * uVar6) + uVar9;
      if (iVar7 >> 4 < 1) {
        iVar7 = 0;
      }
      uVar8 = iVar7 >> 4;
      if (0x3fe < (int)uVar8) {
        uVar8 = 0x3ff;
      }
      uVar10 = uVar10 & 0xff;
      iVar7 = ((int)sVar2 -
              ((int)yuvconstants->kUVToG[1] * uVar10 + (int)yuvconstants->kUVToG[0] * uVar6)) +
              uVar9;
      if (iVar7 >> 4 < 1) {
        iVar7 = 0;
      }
      iVar7 = iVar7 >> 4;
      if (0x3fe < iVar7) {
        iVar7 = 0x3ff;
      }
      iVar5 = ((int)sVar3 - (int)yuvconstants->kUVToR[1] * uVar10) + uVar9;
      if (iVar5 >> 4 < 1) {
        iVar5 = 0;
      }
      iVar5 = iVar5 >> 4;
      if (0x3fe < iVar5) {
        iVar5 = 0x3ff;
      }
      *(uint *)rgb_buf = uVar8 | iVar5 << 0x14 | iVar7 << 10 | 0xc0000000;
      uVar9 = (uint)((short)src_y[1] * iVar4) >> 0x10;
      iVar7 = ((int)sVar1 - (int)yuvconstants->kUVToB[0] * uVar6) + uVar9;
      if (iVar7 >> 4 < 1) {
        iVar7 = 0;
      }
      uVar8 = iVar7 >> 4;
      if (0x3fe < (int)uVar8) {
        uVar8 = 0x3ff;
      }
      iVar7 = (uVar9 + (int)sVar2) -
              ((int)yuvconstants->kUVToG[1] * uVar10 + (int)yuvconstants->kUVToG[0] * uVar6);
      if (iVar7 >> 4 < 1) {
        iVar7 = 0;
      }
      iVar7 = iVar7 >> 4;
      if (0x3fe < iVar7) {
        iVar7 = 0x3ff;
      }
      iVar5 = (uVar9 + (int)sVar3) - (int)yuvconstants->kUVToR[1] * uVar10;
      if (iVar5 >> 4 < 1) {
        iVar5 = 0;
      }
      iVar5 = iVar5 >> 4;
      if (0x3fe < iVar5) {
        iVar5 = 0x3ff;
      }
      *(uint *)((long)rgb_buf + 4) = uVar8 | iVar5 << 0x14 | iVar7 << 10 | 0xc0000000;
      src_y = src_y + 2;
      src_u = src_u + 1;
      src_v = src_v + 1;
      rgb_buf = (uint8_t *)((long)rgb_buf + 8);
      iVar11 = iVar11 + 2;
    } while (iVar11 < width + -1);
  }
  if ((width & 1U) != 0) {
    uVar6 = (uint)(int)(short)*src_u >> 2;
    if (0xfe < (int)(short)*src_u >> 2) {
      uVar6 = 0xff;
    }
    uVar9 = (uint)(int)(short)*src_v >> 2;
    if (0xfe < (int)(short)*src_v >> 2) {
      uVar9 = 0xff;
    }
    uVar8 = (uint)((int)yuvconstants->kYToRgb[0] * (int)(short)*src_y) >> 10 & 0xffff;
    uVar10 = (int)(((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uVar6 & 0xff))
                  + uVar8) >> 4;
    uVar6 = (int)(((int)yuvconstants->kUVBiasG[0] -
                  ((int)yuvconstants->kUVToG[1] * (uVar9 & 0xff) +
                  (uVar6 & 0xff) * (int)yuvconstants->kUVToG[0])) + uVar8) >> 4;
    uVar9 = (int)(((int)yuvconstants->kUVBiasR[0] - (uVar9 & 0xff) * (int)yuvconstants->kUVToR[1]) +
                 uVar8) >> 4;
    uVar8 = 0;
    if ((int)uVar10 < 1) {
      uVar10 = uVar8;
    }
    if (0x3fe < (int)uVar10) {
      uVar10 = 0x3ff;
    }
    if ((int)uVar6 < 1) {
      uVar6 = uVar8;
    }
    if (0x3fe < (int)uVar6) {
      uVar6 = 0x3ff;
    }
    if ((int)uVar9 < 1) {
      uVar9 = uVar8;
    }
    if (0x3fe < (int)uVar9) {
      uVar9 = 0x3ff;
    }
    *(uint *)rgb_buf = (uVar6 << 10 | uVar10) + uVar9 * 0x100000 + 0xc0000000;
  }
  return;
}

Assistant:

void I210ToAR30Row_C(const uint16_t* src_y,
                     const uint16_t* src_u,
                     const uint16_t* src_v,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  int b;
  int g;
  int r;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel16(src_y[0], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf, b, g, r);
    YuvPixel16(src_y[1], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf + 4, b, g, r);
    src_y += 2;
    src_u += 1;
    src_v += 1;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel16(src_y[0], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf, b, g, r);
  }
}